

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.h
# Opt level: O2

void __thiscall
iqxmlrpc::Http_proxy_client_connection::~Http_proxy_client_connection
          (Http_proxy_client_connection *this)

{
  ~Http_proxy_client_connection
            ((Http_proxy_client_connection *)
             &this[-1].super_Http_client_connection.super_Client_connection.preader.total_sz);
  return;
}

Assistant:

class LIBIQXMLRPC_API Http_proxy_client_connection:
  public Http_client_connection
{
public:
  Http_proxy_client_connection( const iqnet::Socket& s, bool non_block ):
    Http_client_connection( s, non_block ) {}

private:
  virtual std::string decorate_uri() const;
}